

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeFragmentApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::begin_query(NegativeTestContext *ctx)

{
  undefined8 uVar1;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  GLuint local_1c;
  GLuint local_18;
  GLuint ids [3];
  NegativeTestContext *ctx_local;
  
  ids._4_8_ = ctx;
  glu::CallLogWrapper::glGenQueries(&ctx->super_CallLogWrapper,3,&local_1c);
  uVar1 = ids._4_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "GL_INVALID_ENUM is generated if target is not one of the accepted tokens.",&local_41);
  NegativeTestContext::beginSection((NegativeTestContext *)uVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glBeginQuery((CallLogWrapper *)ids._4_8_,0xffffffff,local_1c);
  NegativeTestContext::expectError((NegativeTestContext *)ids._4_8_,0x500);
  NegativeTestContext::endSection((NegativeTestContext *)ids._4_8_);
  uVar1 = ids._4_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "GL_INVALID_OPERATION is generated if ctx.glBeginQuery is executed while a query object of the same target is already active."
             ,&local_79);
  NegativeTestContext::beginSection((NegativeTestContext *)uVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  glu::CallLogWrapper::glBeginQuery((CallLogWrapper *)ids._4_8_,0x8c2f,local_1c);
  NegativeTestContext::expectError((NegativeTestContext *)ids._4_8_,0);
  glu::CallLogWrapper::glBeginQuery((CallLogWrapper *)ids._4_8_,0x8c2f,local_18);
  NegativeTestContext::expectError((NegativeTestContext *)ids._4_8_,0x502);
  glu::CallLogWrapper::glBeginQuery((CallLogWrapper *)ids._4_8_,0x8d6a,local_18);
  NegativeTestContext::expectError((NegativeTestContext *)ids._4_8_,0x502);
  glu::CallLogWrapper::glBeginQuery((CallLogWrapper *)ids._4_8_,0x8c88,local_18);
  NegativeTestContext::expectError((NegativeTestContext *)ids._4_8_,0);
  glu::CallLogWrapper::glBeginQuery((CallLogWrapper *)ids._4_8_,0x8c88,ids[0]);
  NegativeTestContext::expectError((NegativeTestContext *)ids._4_8_,0x502);
  glu::CallLogWrapper::glEndQuery((CallLogWrapper *)ids._4_8_,0x8c2f);
  glu::CallLogWrapper::glEndQuery((CallLogWrapper *)ids._4_8_,0x8c88);
  NegativeTestContext::expectError((NegativeTestContext *)ids._4_8_,0);
  NegativeTestContext::endSection((NegativeTestContext *)ids._4_8_);
  uVar1 = ids._4_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"GL_INVALID_OPERATION is generated if id is 0.",&local_a1);
  NegativeTestContext::beginSection((NegativeTestContext *)uVar1,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  glu::CallLogWrapper::glBeginQuery((CallLogWrapper *)ids._4_8_,0x8c2f,0);
  NegativeTestContext::expectError((NegativeTestContext *)ids._4_8_,0x502);
  NegativeTestContext::endSection((NegativeTestContext *)ids._4_8_);
  uVar1 = ids._4_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,
             "GL_INVALID_OPERATION is generated if id not a name returned from a previous call to ctx.glGenQueries, or if such a name has since been deleted with ctx.glDeleteQueries."
             ,&local_c9);
  NegativeTestContext::beginSection((NegativeTestContext *)uVar1,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  glu::CallLogWrapper::glBeginQuery((CallLogWrapper *)ids._4_8_,0x8c2f,0xffffffff);
  NegativeTestContext::expectError((NegativeTestContext *)ids._4_8_,0x502);
  glu::CallLogWrapper::glDeleteQueries((CallLogWrapper *)ids._4_8_,1,ids);
  NegativeTestContext::expectError((NegativeTestContext *)ids._4_8_,0);
  glu::CallLogWrapper::glBeginQuery((CallLogWrapper *)ids._4_8_,0x8c2f,ids[0]);
  NegativeTestContext::expectError((NegativeTestContext *)ids._4_8_,0x502);
  NegativeTestContext::endSection((NegativeTestContext *)ids._4_8_);
  uVar1 = ids._4_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,
             "GL_INVALID_OPERATION is generated if id is the name of an already active query object."
             ,&local_f1);
  NegativeTestContext::beginSection((NegativeTestContext *)uVar1,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  glu::CallLogWrapper::glBeginQuery((CallLogWrapper *)ids._4_8_,0x8c2f,local_1c);
  NegativeTestContext::expectError((NegativeTestContext *)ids._4_8_,0);
  glu::CallLogWrapper::glBeginQuery((CallLogWrapper *)ids._4_8_,0x8c88,local_1c);
  NegativeTestContext::expectError((NegativeTestContext *)ids._4_8_,0x502);
  NegativeTestContext::endSection((NegativeTestContext *)ids._4_8_);
  uVar1 = ids._4_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,
             "GL_INVALID_OPERATION is generated if id refers to an existing query object whose type does not does not match target."
             ,&local_119);
  NegativeTestContext::beginSection((NegativeTestContext *)uVar1,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  glu::CallLogWrapper::glEndQuery((CallLogWrapper *)ids._4_8_,0x8c2f);
  NegativeTestContext::expectError((NegativeTestContext *)ids._4_8_,0);
  glu::CallLogWrapper::glBeginQuery((CallLogWrapper *)ids._4_8_,0x8c88,local_1c);
  NegativeTestContext::expectError((NegativeTestContext *)ids._4_8_,0x502);
  NegativeTestContext::endSection((NegativeTestContext *)ids._4_8_);
  glu::CallLogWrapper::glDeleteQueries((CallLogWrapper *)ids._4_8_,2,&local_1c);
  NegativeTestContext::expectError((NegativeTestContext *)ids._4_8_,0);
  return;
}

Assistant:

void begin_query (NegativeTestContext& ctx)
{
	GLuint ids[3];
	ctx.glGenQueries	(3, ids);

	ctx.beginSection("GL_INVALID_ENUM is generated if target is not one of the accepted tokens.");
	ctx.glBeginQuery	(-1, ids[0]);
	ctx.expectError		(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if ctx.glBeginQuery is executed while a query object of the same target is already active.");
	ctx.glBeginQuery	(GL_ANY_SAMPLES_PASSED, ids[0]);
	ctx.expectError		(GL_NO_ERROR);
	ctx.glBeginQuery	(GL_ANY_SAMPLES_PASSED, ids[1]);
	ctx.expectError		(GL_INVALID_OPERATION);
	// \note GL_ANY_SAMPLES_PASSED and GL_ANY_SAMPLES_PASSED_CONSERVATIVE alias to the same target for the purposes of this error.
	ctx.glBeginQuery	(GL_ANY_SAMPLES_PASSED_CONSERVATIVE, ids[1]);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.glBeginQuery	(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN, ids[1]);
	ctx.expectError		(GL_NO_ERROR);
	ctx.glBeginQuery	(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN, ids[2]);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.glEndQuery		(GL_ANY_SAMPLES_PASSED);
	ctx.glEndQuery		(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN);
	ctx.expectError		(GL_NO_ERROR);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if id is 0.");
	ctx.glBeginQuery	(GL_ANY_SAMPLES_PASSED, 0);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if id not a name returned from a previous call to ctx.glGenQueries, or if such a name has since been deleted with ctx.glDeleteQueries.");
	ctx.glBeginQuery	(GL_ANY_SAMPLES_PASSED, -1);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.glDeleteQueries	(1, &ids[2]);
	ctx.expectError		(GL_NO_ERROR);
	ctx.glBeginQuery	(GL_ANY_SAMPLES_PASSED, ids[2]);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if id is the name of an already active query object.");
	ctx.glBeginQuery	(GL_ANY_SAMPLES_PASSED, ids[0]);
	ctx.expectError		(GL_NO_ERROR);
	ctx.glBeginQuery	(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN, ids[0]);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if id refers to an existing query object whose type does not does not match target.");
	ctx.glEndQuery		(GL_ANY_SAMPLES_PASSED);
	ctx.expectError		(GL_NO_ERROR);
	ctx.glBeginQuery	(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN, ids[0]);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteQueries	(2, &ids[0]);
	ctx.expectError		(GL_NO_ERROR);
}